

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  Bytef BVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ushort uVar16;
  
  if (-1 < max_code) {
    uVar2 = (tree->dl).dad;
    uVar5 = 7;
    if (uVar2 == 0) {
      uVar5 = 0x8a;
    }
    iVar7 = (uVar2 != 0) + 3;
    uVar13 = 0;
    uVar10 = 0xffffffff;
    iVar15 = 0;
    uVar11 = (uint)uVar2;
    do {
      uVar14 = (ulong)uVar11;
      uVar2 = tree[uVar13 + 1].dl.dad;
      uVar12 = (uint)uVar2;
      iVar8 = iVar15 + 1;
      if (((int)uVar5 <= iVar8) || (uVar11 != uVar12)) {
        if (iVar8 < iVar7) {
          iVar7 = s->bi_valid;
          do {
            uVar3 = s->bl_tree[uVar14].dl.dad;
            uVar4 = s->bl_tree[uVar14].fc.freq;
            uVar16 = uVar4 << ((byte)iVar7 & 0x1f) | s->bi_buf;
            s->bi_buf = uVar16;
            if ((int)(0x10 - (uint)uVar3) < iVar7) {
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = (Bytef)uVar16;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = BVar1;
              s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
              iVar7 = (uint)uVar3 + s->bi_valid + -0x10;
            }
            else {
              iVar7 = iVar7 + (uint)uVar3;
            }
            s->bi_valid = iVar7;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        else {
          iVar7 = s->bi_valid;
          bVar6 = (byte)iVar7;
          if (uVar11 == 0) {
            if (iVar15 < 10) {
              uVar3 = s->bl_tree[0x11].dl.dad;
              uVar4 = s->bl_tree[0x11].fc.freq;
              uVar5 = (uint)s->bi_buf | (uint)uVar4 << (bVar6 & 0x1f);
              if ((int)(0x10 - (uint)uVar3) < iVar7) {
                s->bi_buf = (ush)uVar5;
                uVar9 = s->pending;
                s->pending = uVar9 + 1;
                s->pending_buf[uVar9] = (Bytef)uVar5;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
                uVar5 = (uint)(uVar4 >> (0x10U - (char)s->bi_valid & 0x1f));
              }
              else {
                iVar7 = iVar7 + (uint)uVar3;
              }
              s->bi_valid = iVar7;
              if (iVar7 < 0xe) {
                s->bi_buf = (ushort)uVar5 | (ushort)(iVar15 + 0xfffe << ((byte)iVar7 & 0x1f));
                iVar7 = iVar7 + 3;
              }
              else {
                uVar5 = uVar5 | iVar15 - 2U << ((byte)iVar7 & 0x1f);
                s->bi_buf = (ush)uVar5;
                uVar9 = s->pending;
                s->pending = uVar9 + 1;
                s->pending_buf[uVar9] = (Bytef)uVar5;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                s->bi_buf = (ush)((iVar15 - 2U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
                iVar7 = s->bi_valid + -0xd;
              }
            }
            else {
              uVar3 = s->bl_tree[0x12].dl.dad;
              uVar4 = s->bl_tree[0x12].fc.freq;
              uVar5 = (uint)s->bi_buf | (uint)uVar4 << (bVar6 & 0x1f);
              if ((int)(0x10 - (uint)uVar3) < iVar7) {
                s->bi_buf = (ush)uVar5;
                uVar9 = s->pending;
                s->pending = uVar9 + 1;
                s->pending_buf[uVar9] = (Bytef)uVar5;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
                uVar5 = (uint)(uVar4 >> (0x10U - (char)s->bi_valid & 0x1f));
              }
              else {
                iVar7 = iVar7 + (uint)uVar3;
              }
              s->bi_valid = iVar7;
              if (iVar7 < 10) {
                s->bi_buf = (ushort)uVar5 | (ushort)(iVar15 + 0xfff6 << ((byte)iVar7 & 0x1f));
                iVar7 = iVar7 + 7;
              }
              else {
                uVar5 = uVar5 | iVar15 - 10U << ((byte)iVar7 & 0x1f);
                s->bi_buf = (ush)uVar5;
                uVar9 = s->pending;
                s->pending = uVar9 + 1;
                s->pending_buf[uVar9] = (Bytef)uVar5;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                s->bi_buf = (ush)((iVar15 - 10U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
                iVar7 = s->bi_valid + -9;
              }
            }
          }
          else {
            if (uVar11 != (uint)uVar10) {
              uVar3 = s->bl_tree[uVar14].dl.dad;
              uVar4 = s->bl_tree[uVar14].fc.freq;
              uVar16 = uVar4 << (bVar6 & 0x1f) | s->bi_buf;
              s->bi_buf = uVar16;
              if ((int)(0x10 - (uint)uVar3) < iVar7) {
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = (Bytef)uVar16;
                BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
                uVar5 = s->pending;
                s->pending = uVar5 + 1;
                s->pending_buf[uVar5] = BVar1;
                s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
                iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
              }
              else {
                iVar7 = iVar7 + (uint)uVar3;
              }
              s->bi_valid = iVar7;
              iVar8 = iVar15;
            }
            uVar3 = s->bl_tree[0x10].dl.dad;
            uVar4 = s->bl_tree[0x10].fc.freq;
            uVar16 = uVar4 << ((byte)iVar7 & 0x1f) | s->bi_buf;
            if ((int)(0x10 - (uint)uVar3) < iVar7) {
              s->bi_buf = uVar16;
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = (Bytef)uVar16;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = BVar1;
              uVar16 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
              iVar7 = s->bi_valid + (uint)uVar3 + -0x10;
            }
            else {
              iVar7 = iVar7 + (uint)uVar3;
            }
            s->bi_valid = iVar7;
            if (iVar7 < 0xf) {
              s->bi_buf = uVar16 | (ushort)(iVar8 + 0xfffd << ((byte)iVar7 & 0x1f));
              iVar7 = iVar7 + 2;
            }
            else {
              uVar9 = (uint)uVar16 | iVar8 - 3U << ((byte)iVar7 & 0x1f);
              s->bi_buf = (ush)uVar9;
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = (Bytef)uVar9;
              BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
              uVar5 = s->pending;
              s->pending = uVar5 + 1;
              s->pending_buf[uVar5] = BVar1;
              s->bi_buf = (ush)((iVar8 - 3U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
              iVar7 = s->bi_valid + -0xe;
            }
          }
          s->bi_valid = iVar7;
        }
        uVar10 = uVar14;
        iVar8 = 0;
        if (uVar2 == 0) {
          uVar5 = 0x8a;
          iVar7 = 3;
        }
        else {
          iVar7 = 4 - (uint)(uVar11 == uVar12);
          uVar5 = uVar11 == uVar12 ^ 7;
        }
      }
      iVar15 = iVar8;
      uVar13 = uVar13 + 1;
      uVar11 = uVar12;
    } while (uVar13 != max_code + 1);
  }
  return;
}

Assistant:

local void send_tree (s, tree, max_code)
    deflate_state *s;
    ct_data *tree; /* the tree to be scanned */
    int max_code;       /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(s, curlen, s->bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree); send_bits(s, count-3, 2);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree); send_bits(s, count-3, 3);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree); send_bits(s, count-11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}